

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

void add_alternate_spell_message
               (monster_race *r,wchar_t s_idx,monster_altmsg_type msg_type,char *msg)

{
  _Bool _Var1;
  monster_altmsg *pmVar2;
  char *pcVar3;
  
  pmVar2 = (monster_altmsg *)mem_alloc(0x18);
  pmVar2->next = r->spell_msgs;
  r->spell_msgs = pmVar2;
  if (msg == (char *)0x0) {
    pcVar3 = "";
  }
  else {
    _Var1 = contains_only_spaces(msg);
    pcVar3 = "";
    if (!_Var1) {
      pcVar3 = msg;
    }
  }
  pcVar3 = string_make(pcVar3);
  pmVar2->message = pcVar3;
  pmVar2->msg_type = msg_type;
  if (0xffff < (uint)s_idx) {
    __assert_fail("s_idx >= 0 && s_idx <= 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                  ,0x5a6,
                  "void add_alternate_spell_message(struct monster_race *, int, enum monster_altmsg_type, const char *)"
                 );
  }
  pmVar2->index = (uint16_t)s_idx;
  return;
}

Assistant:

static void add_alternate_spell_message(struct monster_race *r,
		int s_idx, enum monster_altmsg_type msg_type, const char *msg)
{
	struct monster_altmsg *alt = mem_alloc(sizeof(*alt));

	alt->next = r->spell_msgs;
	r->spell_msgs = alt;
	if (msg == NULL || contains_only_spaces(msg)) {
		alt->message = string_make("");
	} else {
		alt->message = string_make(msg);
	}
	alt->msg_type = msg_type;
	assert(s_idx >= 0 && s_idx <= 0xFFFF);
	alt->index = (uint16_t) s_idx;
}